

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

void __thiscall
duckdb::BindContext::TransferUsingBinding
          (BindContext *this,BindContext *current_context,
          optional_ptr<duckdb::UsingColumnSet,_true> current_set,UsingColumnSet *new_set,
          string *using_column)

{
  UsingColumnSet *set;
  optional_ptr<duckdb::UsingColumnSet,_true> local_20;
  
  local_20.ptr = current_set.ptr;
  AddUsingBinding(this,using_column,new_set);
  if (current_set.ptr != (UsingColumnSet *)0x0) {
    set = optional_ptr<duckdb::UsingColumnSet,_true>::operator*(&local_20);
    RemoveUsingBinding(current_context,using_column,set);
  }
  return;
}

Assistant:

void BindContext::TransferUsingBinding(BindContext &current_context, optional_ptr<UsingColumnSet> current_set,
                                       UsingColumnSet &new_set, const string &using_column) {
	AddUsingBinding(using_column, new_set);
	if (current_set) {
		current_context.RemoveUsingBinding(using_column, *current_set);
	}
}